

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::useNameFilter(QFileDialogPrivate *this,int index)

{
  bool bVar1;
  int iVar2;
  AcceptMode AVar3;
  qsizetype qVar4;
  QFileDialogOptions *pQVar5;
  const_reference pQVar6;
  QString *pQVar7;
  int in_ESI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  qsizetype fileNameExtensionLength;
  QAbstractItemModel *comboModel;
  QString fileNameExtension;
  QString fileName;
  QString newNameFilterExtension;
  QStringList newNameFilters;
  QString nameFilter;
  QStringList nameFilters;
  QString *in_stack_fffffffffffffe68;
  QAbstractItemView *in_stack_fffffffffffffe70;
  QAbstractItemModel *in_stack_fffffffffffffe78;
  QAbstractItemModel *pQVar8;
  undefined4 in_stack_fffffffffffffe88;
  QFileInfo local_140 [8];
  QString local_138;
  QString local_120;
  QFileInfo local_108 [32];
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  QList<QString> local_d0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  undefined1 local_70 [48];
  QList<QString> local_40;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x7570b8);
  QFileDialogOptions::nameFilters();
  qVar4 = QList<QString>::size(&local_40);
  if (in_ESI == qVar4) {
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    in_stack_fffffffffffffe78 = QComboBox::model((QComboBox *)in_RDI);
    pQVar8 = in_stack_fffffffffffffe78;
    QModelIndex::QModelIndex((QModelIndex *)0x757133);
    iVar2 = (**(code **)(*(long *)in_stack_fffffffffffffe78 + 0x78))
                      (in_stack_fffffffffffffe78,local_88);
    iVar2 = iVar2 + -1;
    QModelIndex::QModelIndex((QModelIndex *)0x75715a);
    (**(code **)(*(long *)pQVar8 + 0x60))(local_70,pQVar8,iVar2,0,local_a0);
    QModelIndex::data((QModelIndex *)CONCAT44(iVar2,in_stack_fffffffffffffe88),
                      (int)((ulong)pQVar8 >> 0x20));
    ::QVariant::toString();
    QList<QString>::append((QList<QString> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    QString::~QString((QString *)0x7571c9);
    ::QVariant::~QVariant(&local_28);
    pQVar5 = QSharedPointer<QFileDialogOptions>::operator->
                       ((QSharedPointer<QFileDialogOptions> *)0x7571e7);
    QFileDialogOptions::setNameFilters((QList_conflict2 *)pQVar5);
  }
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe70,
                     (qsizetype)in_stack_fffffffffffffe68);
  QString::QString((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_d0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QPlatformFileDialogHelper::cleanFilterList((QString *)&local_d0);
  q_func(in_RDI);
  AVar3 = QFileDialog::acceptMode((QFileDialog *)in_stack_fffffffffffffe70);
  if (AVar3 == AcceptSave) {
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x7572dd);
    qVar4 = QList<QString>::size(&local_d0);
    if (0 < qVar4) {
      pQVar6 = QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe70,
                                  (qsizetype)in_stack_fffffffffffffe68);
      QFileInfo::QFileInfo(local_108,(QString *)pQVar6);
      QFileInfo::suffix();
      QString::operator=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QString::~QString((QString *)0x757348);
      QFileInfo::~QFileInfo(local_108);
    }
    local_120.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_120.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_120.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    lineEdit((QFileDialogPrivate *)0x757389);
    QLineEdit::text((QLineEdit *)in_stack_fffffffffffffe78);
    local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(local_140,(QString *)&local_120);
    QFileInfo::suffix();
    QFileInfo::~QFileInfo(local_140);
    bVar1 = QString::isEmpty((QString *)0x7573ec);
    if (!bVar1) {
      bVar1 = QString::isEmpty((QString *)0x7573fd);
      if (!bVar1) {
        pQVar7 = (QString *)QString::size(&local_138);
        qVar4 = QString::size(&local_120);
        QString::replace((longlong)&local_120,qVar4 - (long)pQVar7,pQVar7);
        QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                  (&in_RDI->qFileDialogUi);
        QAbstractItemView::clearSelection(in_stack_fffffffffffffe70);
        lineEdit((QFileDialogPrivate *)0x757460);
        QLineEdit::setText((QLineEdit *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
    }
    QString::~QString((QString *)0x757477);
    QString::~QString((QString *)0x757481);
    QString::~QString((QString *)0x75748e);
  }
  QFileSystemModel::setNameFilters((QList_conflict2 *)in_RDI->model);
  QList<QString>::~QList((QList<QString> *)0x7574b6);
  QString::~QString((QString *)0x7574c3);
  QList<QString>::~QList((QList<QString> *)0x7574d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::useNameFilter(int index)
{
    QStringList nameFilters = options->nameFilters();
    if (index == nameFilters.size()) {
        QAbstractItemModel *comboModel = qFileDialogUi->fileTypeCombo->model();
        nameFilters.append(comboModel->index(comboModel->rowCount() - 1, 0).data().toString());
        options->setNameFilters(nameFilters);
    }

    QString nameFilter = nameFilters.at(index);
    QStringList newNameFilters = QPlatformFileDialogHelper::cleanFilterList(nameFilter);
    if (q_func()->acceptMode() == QFileDialog::AcceptSave) {
        QString newNameFilterExtension;
        if (newNameFilters.size() > 0)
            newNameFilterExtension = QFileInfo(newNameFilters.at(0)).suffix();

        QString fileName = lineEdit()->text();
        const QString fileNameExtension = QFileInfo(fileName).suffix();
        if (!fileNameExtension.isEmpty() && !newNameFilterExtension.isEmpty()) {
            const qsizetype fileNameExtensionLength = fileNameExtension.size();
            fileName.replace(fileName.size() - fileNameExtensionLength,
                             fileNameExtensionLength, newNameFilterExtension);
            qFileDialogUi->listView->clearSelection();
            lineEdit()->setText(fileName);
        }
    }

    model->setNameFilters(newNameFilters);
}